

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall
re2::PrefilterTree::Compile
          (PrefilterTree *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atom_vec)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  bool bVar1;
  ostream *poVar2;
  StdIntMap *pSVar3;
  reference pvVar4;
  size_type sVar5;
  pointer ppVar6;
  bool local_201;
  _Self local_1e0;
  _Self local_1d8;
  iterator it_1;
  _Self local_1c8;
  iterator it;
  bool have_other_guard;
  StdIntMap *parents;
  size_t i;
  LogMessage local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *atom_vec_local;
  PrefilterTree *this_local;
  
  local_18 = atom_vec;
  atom_vec_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if ((this->compiled_ & 1U) == 0) {
    bVar1 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::empty
                      (&this->prefilter_vec_);
    if (!bVar1) {
      this->compiled_ = true;
      AssignUniqueIds(this,local_18);
      for (parents = (StdIntMap *)0x0;
          pSVar3 = (StdIntMap *)
                   std::
                   vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
                   size(&this->entries_), parents < pSVar3;
          parents = (StdIntMap *)&(parents->_M_t)._M_impl.field_0x1) {
        pvVar4 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                 ::operator[](&this->entries_,(size_type)parents);
        this_00 = pvVar4->parents;
        sVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                size(this_00);
        if (8 < sVar5) {
          it._M_node._7_1_ = 1;
          local_1c8._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               begin(this_00);
          while( true ) {
            it_1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   end(this_00);
            bVar1 = std::operator!=(&local_1c8,&it_1);
            if (!bVar1) break;
            local_201 = false;
            if ((it._M_node._7_1_ & 1) != 0) {
              ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_1c8);
              pvVar4 = std::
                       vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                       ::operator[](&this->entries_,(long)ppVar6->first);
              local_201 = 1 < pvVar4->propagate_up_at_count;
            }
            it._M_node._7_1_ = local_201;
            std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_1c8);
          }
          if ((it._M_node._7_1_ & 1) != 0) {
            local_1d8._M_node =
                 (_Base_ptr)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 begin(this_00);
            while( true ) {
              local_1e0._M_node =
                   (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   end(this_00);
              bVar1 = std::operator!=(&local_1d8,&local_1e0);
              if (!bVar1) break;
              ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_1d8);
              pvVar4 = std::
                       vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                       ::operator[](&this->entries_,(long)ppVar6->first);
              pvVar4->propagate_up_at_count = pvVar4->propagate_up_at_count + -1;
              std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_1d8);
            }
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                      (this_00);
          }
        }
      }
      PrintDebugInfo(this);
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter_tree.cc"
               ,0x54);
    poVar2 = LogMessage::stream(&local_198);
    std::operator<<(poVar2,"Compile after Compile.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  return;
}

Assistant:

void PrefilterTree::Compile(vector<string>* atom_vec) {
  if (compiled_) {
    LOG(DFATAL) << "Compile after Compile.";
    return;
  }

  // We do this check to support some legacy uses of
  // PrefilterTree that call Compile before adding any regexps,
  // and expect Compile not to have effect.
  if (prefilter_vec_.empty())
    return;

  compiled_ = true;

  AssignUniqueIds(atom_vec);

  // Identify nodes that are too common among prefilters and are
  // triggering too many parents. Then get rid of them if possible.
  // Note that getting rid of a prefilter node simply means they are
  // no longer necessary for their parent to trigger; that is, we do
  // not miss out on any regexps triggering by getting rid of a
  // prefilter node.
  for (size_t i = 0; i < entries_.size(); i++) {
    StdIntMap* parents = entries_[i].parents;
    if (parents->size() > 8) {
      // This one triggers too many things. If all the parents are AND
      // nodes and have other things guarding them, then get rid of
      // this trigger. TODO(vsri): Adjust the threshold appropriately,
      // make it a function of total number of nodes?
      bool have_other_guard = true;
      for (StdIntMap::iterator it = parents->begin();
           it != parents->end(); ++it) {
        have_other_guard = have_other_guard &&
            (entries_[it->first].propagate_up_at_count > 1);
      }

      if (have_other_guard) {
        for (StdIntMap::iterator it = parents->begin();
             it != parents->end(); ++it)
          entries_[it->first].propagate_up_at_count -= 1;

        parents->clear();  // Forget the parents
      }
    }
  }

  PrintDebugInfo();
}